

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcG.c
# Opt level: O0

void Bmcg_ManStop(Bmcg_Man_t *p)

{
  int local_14;
  int i;
  Bmcg_Man_t *p_local;
  
  Gia_ManStopP(&p->pFrames);
  Gia_ManStopP(&p->pClean);
  Vec_PtrFreeData(&p->vGia2Fr);
  Vec_PtrErase(&p->vGia2Fr);
  Vec_IntErase(&p->vFr2Sat);
  Vec_IntErase(&p->vCiMap);
  for (local_14 = 0; local_14 < p->pPars->nProcs; local_14 = local_14 + 1) {
    if (p->pSats[local_14] != (bmcg_sat_solver *)0x0) {
      bmcg_sat_solver_stop(p->pSats[local_14]);
    }
  }
  if (p != (Bmcg_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Bmcg_ManStop( Bmcg_Man_t * p )
{
    int i;
    Gia_ManStopP( &p->pFrames );
    Gia_ManStopP( &p->pClean );
    Vec_PtrFreeData( &p->vGia2Fr );
    Vec_PtrErase( &p->vGia2Fr );
    Vec_IntErase( &p->vFr2Sat );
    Vec_IntErase( &p->vCiMap );
    for ( i = 0; i < p->pPars->nProcs; i++ )
        if ( p->pSats[i] ) 
            bmcg_sat_solver_stop( p->pSats[i] );
    ABC_FREE( p );
}